

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::reset(CTcDataStream *this)

{
  this->page_cur_ = 0;
  this->ofs_ = 0;
  this->obj_file_start_ofs_ = 0;
  if (this->pages_ != (char **)0x0) {
    this->wp_ = *this->pages_;
    this->rem_ = 65000;
  }
  CTcPrsMem::reset(this->allocator_);
  this->first_anchor_ = (CTcStreamAnchor *)0x0;
  this->last_anchor_ = (CTcStreamAnchor *)0x0;
  return;
}

Assistant:

void CTcDataStream::reset()
{
    /* move the write pointer back to the start */
    ofs_ = 0;
    obj_file_start_ofs_ = 0;

    /* back to the first page */
    page_cur_ = 0;

    /* set up to write to the first page, if we have any pages at all */
    if (pages_ != 0)
    {
        /* we have all of the first page available again */
        wp_ = calc_addr(0);
        rem_ = TCCS_PAGE_SIZE;
    }

    /* reset the allocator */
    allocator_->reset();

    /* 
     *   forget all of the anchors (no need to delete them explicitly -
     *   they were allocated from our allocator pool, which we've reset to
     *   completely discard everything it contained)
     */
    first_anchor_ = last_anchor_ = 0;
}